

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidiin.cpp
# Opt level: O3

int anon_unknown.dwarf_12334::RtMidiIn_setcallback(lua_State *L)

{
  int iVar1;
  mapped_type mVar2;
  RtMidiIn *pRVar3;
  mapped_type *pmVar4;
  iterator iVar5;
  key_type local_38;
  
  lua_getfield(L,0xffffd8f0,"luartmidi.rtmidiin");
  pRVar3 = luaGetUserdata<RtMidiIn>(L,1,"RtMidiIn");
  iVar1 = lua_type(L,2);
  if (iVar1 < 1) {
    MidiInApi::cancelCallback((MidiInApi *)(pRVar3->super_RtMidi).rtapi_);
  }
  else {
    lua_pushvalue(L,2);
    lua_pushvalue(L,3);
    lua_pushcclosure(L,RtMidiIn_callbackwrapper,2);
    mVar2 = luaL_ref(L,0xffffd8f0);
    local_38.first = pRVar3;
    local_38.second = L;
    pmVar4 = std::
             map<std::pair<RtMidiIn_*,_lua_State_*>,_int,_std::less<std::pair<RtMidiIn_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_>_>
             ::operator[]((map<std::pair<RtMidiIn_*,_lua_State_*>,_int,_std::less<std::pair<RtMidiIn_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_>_>
                           *)(anonymous_namespace)::RtMidiIn_callbacks,&local_38);
    *pmVar4 = mVar2;
    local_38.first = pRVar3;
    local_38.second = L;
    iVar5 = std::
            _Rb_tree<std::pair<RtMidiIn_*,_lua_State_*>,_std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>,_std::_Select1st<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_>,_std::less<std::pair<RtMidiIn_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_>_>
            ::find((_Rb_tree<std::pair<RtMidiIn_*,_lua_State_*>,_std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>,_std::_Select1st<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_>,_std::less<std::pair<RtMidiIn_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_>_>
                    *)(anonymous_namespace)::RtMidiIn_callbacks,&local_38);
    MidiInApi::setCallback
              ((MidiInApi *)(pRVar3->super_RtMidi).rtapi_,RtMidiInCustomCallback,iVar5._M_node + 1);
  }
  return 0;
}

Assistant:

int RtMidiIn_setcallback(lua_State *L) {
	auto &self = getRtMidiIn(L, 1);
	if (lua_isnoneornil(L, 2))
		self.cancelCallback();
	else {
		lua_pushvalue(L, 2);
		lua_pushvalue(L, 3);
		lua_pushcclosure(L, RtMidiIn_callbackwrapper, 2);
		RtMidiIn_callbacks[{&self, L}] = luaL_ref(L, LUA_REGISTRYINDEX);
		auto it = RtMidiIn_callbacks.find({&self, L});
		self.setCallback(RtMidiInCustomCallback,
		 static_cast<void *>(const_cast<RtMidiIn_callback_rec *>(&it->first)));
	}
	return 0;
}